

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageOneofFieldGenerator::GenerateGetterDeclaration
          (MessageOneofFieldGenerator *this,Printer *printer)

{
  Printer *printer_local;
  MessageOneofFieldGenerator *this_local;
  
  if (((this->super_MessageFieldGenerator).dependent_field_ & 1U) == 0) {
    io::Printer::Print(printer,&(this->super_MessageFieldGenerator).variables_,
                       "$deprecated_attr$const $type$& $name$() const;\n");
  }
  return;
}

Assistant:

void MessageOneofFieldGenerator::
GenerateGetterDeclaration(io::Printer* printer) const {
  // Oneof field getters must be dependent as they call default_instance().
  // Unlike MessageField, this means there is no (non-dependent) getter to
  // generate.
  if (dependent_field_) {
    return;
  }
  printer->Print(variables_,
      "$deprecated_attr$const $type$& $name$() const;\n");
}